

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall re2::Compiler::Alt(Compiler *this,Frag a,Frag b)

{
  Inst *pIVar1;
  Frag FVar2;
  PatchList PVar3;
  PatchList PVar4;
  PatchList PVar5;
  PatchList PVar6;
  byte bVar7;
  ulong uVar8;
  uint local_58;
  uint32_t uStack_54;
  uint32_t uStack_50;
  int iStack_4c;
  uint32_t local_40;
  uint32_t uStack_3c;
  bool bStack_34;
  uint32_t local_30;
  uint32_t uStack_2c;
  
  local_30 = a.begin;
  uStack_2c = a.end.head;
  local_40 = b.begin;
  uStack_3c = b.end.head;
  if (local_30 == 0) {
    uStack_50 = b.end.tail;
    iStack_4c = b._12_4_;
    local_58 = local_40;
    uStack_54 = uStack_3c;
  }
  else if (local_40 == 0) {
    uStack_50 = a.end.tail;
    iStack_4c = a._12_4_;
    local_58 = local_30;
    uStack_54 = uStack_2c;
  }
  else {
    local_58 = AllocInst(this,1);
    if ((int)local_58 < 0) {
      local_58 = 0;
      uStack_54 = 0;
      uStack_50 = 0;
      iStack_4c = (uint)iStack_4c._1_3_ << 8;
    }
    else {
      Prog::Inst::InitAlt((this->inst_).ptr_._M_t.
                          super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + local_58,
                          local_30,local_40);
      PVar4 = a.end;
      PVar3 = b.end;
      PVar5 = PVar3;
      PVar6 = PVar3;
      if ((uStack_2c != 0) && (PVar5 = PVar4, PVar6 = PVar4, uStack_3c != 0)) {
        pIVar1 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar8 = (ulong)PVar4 >> 0x21;
        if (((undefined1  [16])a & (undefined1  [16])0x0) == (undefined1  [16])0x0) {
          pIVar1[uVar8].out_opcode_ = pIVar1[uVar8].out_opcode_ & 0xf | uStack_3c << 4;
          PVar6 = PVar3;
        }
        else {
          pIVar1[uVar8].field_1.out1_ = uStack_3c;
          PVar6 = PVar3;
        }
      }
      uStack_50 = PVar6.tail;
      bStack_34 = b.nullable;
      bVar7 = 1;
      if (((undefined1  [16])a & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        bVar7 = bStack_34 & 1;
      }
      uStack_54 = PVar5.head;
      iStack_4c = CONCAT31(iStack_4c._1_3_,bVar7);
    }
  }
  FVar2.end.head = uStack_54;
  FVar2.begin = local_58;
  FVar2.end.tail = uStack_50;
  FVar2._12_4_ = iStack_4c;
  return FVar2;
}

Assistant:

Frag Compiler::Alt(Frag a, Frag b) {
  // Special case for convenience in loops.
  if (IsNoMatch(a))
    return b;
  if (IsNoMatch(b))
    return a;

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();

  inst_[id].InitAlt(a.begin, b.begin);
  return Frag(id, PatchList::Append(inst_.data(), a.end, b.end),
              a.nullable || b.nullable);
}